

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::VerifyLinkItemIsTarget
          (cmGeneratorTarget *this,LinkItemRole role,cmLinkItem *item)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  long lVar4;
  cmake *this_00;
  string_view str;
  string_view str_00;
  string_view prefix;
  string_view prefix_00;
  char *local_b8;
  cmListFileBacktrace backtrace;
  string e;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  
  if (item->Target != (cmGeneratorTarget *)0x0) {
    return true;
  }
  psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
  if (psVar3->_M_string_length != 0) {
    uVar2 = (byte)*(psVar3->_M_dataplus)._M_p - 0x24;
    if ((uVar2 < 0x3d) && ((0x1000000000000201U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      return true;
    }
    lVar4 = std::__cxx11::string::find_first_of((char *)psVar3,0x632e9c);
    if (lVar4 != -1) {
      return true;
    }
    str._M_str = (psVar3->_M_dataplus)._M_p;
    str._M_len = psVar3->_M_string_length;
    prefix._M_str = "<LINK_LIBRARY:";
    prefix._M_len = 0xe;
    bVar1 = cmHasPrefix(str,prefix);
    if (bVar1) {
      return true;
    }
    str_00._M_str = (psVar3->_M_dataplus)._M_p;
    str_00._M_len = psVar3->_M_string_length;
    prefix_00._M_str = "<LINK_GROUP:";
    prefix_00._M_len = 0xc;
    bVar1 = cmHasPrefix(str_00,prefix_00);
    if (bVar1) {
      return true;
    }
  }
  backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x8;
  backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x616a4d;
  psVar3 = GetName_abi_cxx11_(this);
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(psVar3->_M_dataplus)._M_p;
  local_60 = (element_type *)psVar3->_M_string_length;
  local_b8 = "its link interface contains";
  if (role == Implementation) {
    local_b8 = "it links to";
  }
  psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
  cmStrCat<char[48],char_const*,char[5],std::__cxx11::string,char[26],std::basic_string_view<char,std::char_traits<char>>>
            (&e,(cmAlphaNum *)&backtrace,(cmAlphaNum *)&stack0xffffffffffffffa0,
             (char (*) [48])"\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ",&local_b8,
             (char (*) [5])0x64dac3,psVar3,(char (*) [26])"\nwhich is not a target.  ",
             (basic_string_view<char,_std::char_traits<char>_> *)
             (anonymous_namespace)::missingTargetPossibleReasons);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&backtrace,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&item->Backtrace);
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&backtrace);
  if (bVar1) {
    GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffa0);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&backtrace,
                (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&stack0xffffffffffffffa0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffa8);
  }
  this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
  cmake::IssueMessage(this_00,FATAL_ERROR,&e,&backtrace);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool cmGeneratorTarget::VerifyLinkItemIsTarget(LinkItemRole role,
                                               cmLinkItem const& item) const
{
  if (item.Target) {
    return true;
  }
  std::string const& str = item.AsStr();
  if (!str.empty() &&
      (str[0] == '-' || str[0] == '$' || str[0] == '`' ||
       str.find_first_of("/\\") != std::string::npos ||
       cmHasPrefix(str, "<LINK_LIBRARY:"_s) ||
       cmHasPrefix(str, "<LINK_GROUP:"_s))) {
    return true;
  }

  std::string e = cmStrCat("Target \"", this->GetName(),
                           "\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ",
                           role == LinkItemRole::Implementation
                             ? "it links to"
                             : "its link interface contains",
                           ":\n  ", item.AsStr(), "\nwhich is not a target.  ",
                           missingTargetPossibleReasons);
  cmListFileBacktrace backtrace = item.Backtrace;
  if (backtrace.Empty()) {
    backtrace = this->GetBacktrace();
  }
  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e, backtrace);
  return false;
}